

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase107::run(TestCase107 *this)

{
  bool bVar1;
  ReaderOptions options;
  Fault local_188;
  Fault f;
  bool local_16a;
  DebugExpression<bool> local_169;
  undefined1 auStack_168 [7];
  DebugExpression<bool> _kjCondition;
  ArrayPtr<kj::ArrayPtr<const_capnp::word>_> local_158;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> local_148;
  undefined1 local_138 [8];
  SegmentArrayMessageReader messageReader;
  undefined1 local_48 [8];
  ArrayPtr<const_capnp::word> segments [1];
  AlignedData<4> nonNullEmptyStruct;
  TestCase107 *this_local;
  
  segments[0].size_ = 0x2000000000000;
  join_0x00000010_0x00000000_ = kj::arrayPtr<capnp::word>((word *)&segments[0].size_,4);
  _local_48 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&messageReader.segments.size_);
  local_158 = kj::arrayPtr<kj::ArrayPtr<capnp::word_const>>
                        ((ArrayPtr<const_capnp::word> *)local_48,1);
  local_148 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_158);
  _auStack_168 = 0;
  ReaderOptions::ReaderOptions((ReaderOptions *)auStack_168);
  options._8_8_ = 0;
  options.traversalLimitInWords = _auStack_168;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_138,local_148,options);
  local_16a = MessageReader::isCanonical((MessageReader *)local_138);
  local_169 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_16a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_169);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/canonicalize-test.c++"
               ,0x7c,FAILED,"messageReader.isCanonical()","_kjCondition,",&local_169);
    kj::_::Debug::Fault::fatal(&local_188);
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_138);
  return;
}

Assistant:

TEST(Encoding, DefaultsFromEmptyMessage) {
  AlignedData<1> emptyMessage = {{0, 0, 0, 0, 0, 0, 0, 0}};

  kj::ArrayPtr<const word> segments[1] = {kj::arrayPtr(emptyMessage.words, 1)};
  SegmentArrayMessageReader reader(kj::arrayPtr(segments, 1));

  checkTestMessage(reader.getRoot<TestDefaults>());
  checkTestMessage(readMessageUnchecked<TestDefaults>(emptyMessage.words));
}